

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

ON_4fColor __thiscall ON_XMLVariant::AsColor(ON_XMLVariant *this)

{
  Types TVar1;
  ON_4fColor OVar2;
  ON_Color local_24;
  ON_XMLVariant *local_20;
  ON_XMLVariant *this_local;
  ON_4fColor col;
  
  local_20 = this;
  ON_Color::ON_Color(&local_24,0,0,0,0);
  ON_4fColor::ON_4fColor((ON_4fColor *)&this_local,&local_24);
  TVar1 = this->_private->_type;
  if (TVar1 == String) {
    (*this->_vptr_ON_XMLVariant[0x31])(this,4);
  }
  else if (1 < TVar1 - DoubleArray4) {
    OVar2.m_color[0] = this_local._0_4_;
    OVar2.m_color[1] = this_local._4_4_;
    OVar2.m_color[2] = col.m_color[0];
    OVar2.m_color[3] = col.m_color[1];
    return (ON_4fColor)OVar2.m_color;
  }
  ON_4fColor::SetRGBA((ON_4fColor *)&this_local,(float)(this->_private->field_2)._double_val,
                      (float)(this->_private->field_2).m_xform.m_xform[0][1],
                      (float)(this->_private->field_2).m_xform.m_xform[0][2],
                      (float)(this->_private->field_2).m_xform.m_xform[0][3]);
  return (ON_4fColor)_this_local;
}

Assistant:

ON_4fColor ON_XMLVariant::AsColor(void) const
{
  ON_4fColor col(ON_Color(0, 0, 0, 0));

  switch (_private->_type)
  {
  case Types::String:
    StringToPoint(4);
    // No break...
  case Types::DoubleArray4:
  case Types::DoubleColor4:
    col.SetRGBA(float(_private->_array_val[0]), float(_private->_array_val[1]), float(_private->_array_val[2]), float(_private->_array_val[3]));
  
  default:
    break;
  }

  return col;
}